

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::StyledStreamWriter(StyledStreamWriter *this,string *indentation)

{
  pointer pcVar1;
  
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->document_ = (ostream *)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indentString_)._M_dataplus._M_p = (pointer)&(this->indentString_).field_2;
  (this->indentString_)._M_string_length = 0;
  (this->indentString_).field_2._M_local_buf[0] = '\0';
  this->rightMargin_ = 0x4a;
  (this->indentation_)._M_dataplus._M_p = (pointer)&(this->indentation_).field_2;
  pcVar1 = (indentation->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->indentation_,pcVar1,pcVar1 + indentation->_M_string_length);
  this->addChildValues_ = false;
  return;
}

Assistant:

StyledStreamWriter::StyledStreamWriter(std::string indentation)
    : document_(NULL), rightMargin_(74), indentation_(indentation),
      addChildValues_() {}